

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool __thiscall mkvparser::Tags::ExpandTagsArray(Tags *this)

{
  int iVar1;
  uint uVar2;
  Tag *pTVar3;
  long *plVar4;
  long lVar5;
  ulong uVar6;
  Tag *pTVar7;
  int iVar8;
  bool bVar9;
  
  iVar1 = this->m_tags_size;
  uVar2 = this->m_tags_count;
  bVar9 = true;
  if (iVar1 <= (int)uVar2) {
    iVar8 = 1;
    if (iVar1 != 0) {
      iVar8 = iVar1 * 2;
    }
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar8) {
      uVar6 = (long)iVar8 << 4 | 8;
    }
    plVar4 = (long *)operator_new__(uVar6,(nothrow_t *)&std::nothrow);
    if (plVar4 == (long *)0x0) {
      pTVar7 = (Tag *)0x0;
    }
    else {
      *plVar4 = (long)iVar8;
      pTVar7 = (Tag *)(plVar4 + 1);
    }
    bVar9 = pTVar7 != (Tag *)0x0;
    if (bVar9) {
      if (0 < (int)uVar2) {
        pTVar3 = this->m_tags;
        lVar5 = 0;
        do {
          *(undefined8 *)((long)&pTVar7->m_simple_tags + lVar5) =
               *(undefined8 *)((long)&pTVar3->m_simple_tags + lVar5);
          *(undefined4 *)((long)&pTVar7->m_simple_tags_size + lVar5) =
               *(undefined4 *)((long)&pTVar3->m_simple_tags_size + lVar5);
          *(undefined4 *)((long)&pTVar7->m_simple_tags_count + lVar5) =
               *(undefined4 *)((long)&pTVar3->m_simple_tags_count + lVar5);
          lVar5 = lVar5 + 0x10;
        } while ((ulong)uVar2 << 4 != lVar5);
      }
      if (this->m_tags != (Tag *)0x0) {
        operator_delete__(&this->m_tags[-1].m_simple_tags_size);
      }
      this->m_tags = pTVar7;
      this->m_tags_size = iVar8;
    }
  }
  return bVar9;
}

Assistant:

bool Tags::ExpandTagsArray() {
  if (m_tags_size > m_tags_count)
    return true;  // nothing else to do

  const int size = (m_tags_size == 0) ? 1 : 2 * m_tags_size;

  Tag* const tags = new (std::nothrow) Tag[size];

  if (tags == NULL)
    return false;

  for (int idx = 0; idx < m_tags_count; ++idx) {
    m_tags[idx].ShallowCopy(tags[idx]);
  }

  delete[] m_tags;
  m_tags = tags;

  m_tags_size = size;
  return true;
}